

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O3

void __thiscall QToolButton::setMenu(QToolButton *this,QMenu *menu)

{
  long *plVar1;
  long lVar2;
  int *piVar3;
  QAction *pQVar4;
  long lVar5;
  QAction *pQVar6;
  
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  plVar1 = (long *)(lVar2 + 0x2c8);
  if (menu == (QMenu *)0x0) {
    lVar5 = *plVar1;
    if (lVar5 == 0) {
      return;
    }
    pQVar4 = (QAction *)0x0;
LAB_004bb56d:
    if (*(int *)(lVar5 + 4) == 0) {
      pQVar6 = (QAction *)0x0;
    }
    else {
      pQVar6 = *(QAction **)(lVar2 + 0x2d0);
    }
    if (pQVar6 == pQVar4) {
      return;
    }
    if ((*(int *)(lVar5 + 4) != 0) && (*(QAction **)(lVar2 + 0x2d0) != (QAction *)0x0)) {
      pQVar4 = *(QAction **)(lVar2 + 0x2d0);
      if (*(int *)(lVar5 + 4) == 0) {
        pQVar4 = (QAction *)0x0;
      }
      QWidget::removeAction((QWidget *)this,pQVar4);
    }
    if (menu == (QMenu *)0x0) {
      piVar3 = (int *)*plVar1;
      *plVar1 = 0;
      *(undefined8 *)(lVar2 + 0x2d0) = 0;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          operator_delete(piVar3);
        }
      }
      goto LAB_004bb63b;
    }
  }
  else {
    pQVar4 = QMenu::menuAction(menu);
    lVar5 = *plVar1;
    if (lVar5 != 0) goto LAB_004bb56d;
    if (pQVar4 == (QAction *)0x0) {
      return;
    }
  }
  pQVar4 = QMenu::menuAction(menu);
  if (pQVar4 == (QAction *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar4);
  }
  piVar3 = *(int **)(lVar2 + 0x2c8);
  *(long *)(lVar2 + 0x2c8) = lVar5;
  *(QAction **)(lVar2 + 0x2d0) = pQVar4;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
    lVar5 = *plVar1;
  }
  if ((lVar5 == 0) || (*(int *)(lVar5 + 4) == 0)) {
    pQVar4 = (QAction *)0x0;
  }
  else {
    pQVar4 = *(QAction **)(lVar2 + 0x2d0);
  }
  QWidget::addAction((QWidget *)this,pQVar4);
LAB_004bb63b:
  *(undefined8 *)(lVar2 + 0x2ac) = 0xffffffffffffffff;
  QWidget::updateGeometry((QWidget *)this);
  QWidget::update((QWidget *)this);
  return;
}

Assistant:

void QToolButton::setMenu(QMenu* menu)
{
    Q_D(QToolButton);

    if (d->menuAction == (menu ? menu->menuAction() : nullptr))
        return;

    if (d->menuAction)
        removeAction(d->menuAction);

    if (menu) {
        d->menuAction = menu->menuAction();
        addAction(d->menuAction);
    } else {
        d->menuAction = nullptr;
    }

    // changing the menu set may change the size hint, so reset it
    d->sizeHint = QSize();
    updateGeometry();
    update();
}